

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O2

double Abc_GraphCountPaths(Vec_Wec_t *vNodes,Vec_Int_t *vEdges)

{
  uint uVar1;
  double **pCache;
  Vec_Int_t *pVVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  int pBuffer [1000];
  int local_fd8 [1002];
  
  memset(local_fd8,0,4000);
  uVar5 = (ulong)vNodes->nSize;
  pCache = (double **)malloc(uVar5 << 3);
  for (lVar6 = 0; lVar6 < (int)uVar5; lVar6 = lVar6 + 1) {
    pVVar2 = Vec_WecEntry(vNodes,(int)lVar6);
    uVar1 = pVVar2->nSize;
    pdVar3 = (double *)malloc((long)(int)uVar1 << 3);
    pCache[lVar6] = pdVar3;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pdVar3[uVar4] = -1.0;
    }
    uVar5 = (ulong)(uint)vNodes->nSize;
  }
  dVar7 = Abc_GraphCountPaths_rec(0,0,vNodes,pCache,local_fd8,vEdges);
  for (lVar6 = 0; lVar6 < vNodes->nSize; lVar6 = lVar6 + 1) {
    if (pCache[lVar6] != (double *)0x0) {
      free(pCache[lVar6]);
      pCache[lVar6] = (double *)0x0;
    }
  }
  free(pCache);
  return dVar7;
}

Assistant:

double Abc_GraphCountPaths( Vec_Wec_t * vNodes, Vec_Int_t * vEdges )
{
    int i, k, pBuffer[1000] = {0};
    double ** pCache = ABC_ALLOC( double *, Vec_WecSize(vNodes) );
    Vec_Int_t * vLevel;   double Value;
    Vec_WecForEachLevel( vNodes, vLevel, i )
    {
        pCache[i] = ABC_ALLOC( double, Vec_IntSize(vLevel) );
        for ( k = 0; k < Vec_IntSize(vLevel); k++ )
            pCache[i][k] = -1.0;
    }
    Value = Abc_GraphCountPaths_rec( 0, 0, vNodes, pCache, pBuffer, vEdges );
    for ( i = 0; i < Vec_WecSize(vNodes); i++ )
        ABC_FREE( pCache[i] );
    ABC_FREE( pCache );
    return Value;
}